

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int FMstruct_size_field_list(FMFieldList list,int pointer_size)

{
  int iVar1;
  char *pcVar2;
  int in_ESI;
  long in_RDI;
  long elements;
  int field_size;
  int struct_size;
  int i;
  long *in_stack_00000410;
  char *in_stack_00000418;
  int in_stack_ffffffffffffffdc;
  FMFieldList in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  int local_10;
  
  local_10 = 0;
  local_14 = 0;
  while (*(long *)(in_RDI + (long)local_10 * 0x18) != 0) {
    iVar1 = is_var_array_field(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    local_18 = in_ESI;
    if ((iVar1 != 1) &&
       (pcVar2 = strchr(*(char **)(in_RDI + (long)local_10 * 0x18 + 8),0x2a), pcVar2 == (char *)0x0)
       ) {
      FMarray_str_to_data_type(in_stack_00000418,in_stack_00000410);
      local_18 = *(int *)(in_RDI + (long)local_10 * 0x18 + 0x10) * (int)in_stack_ffffffffffffffe0;
    }
    if (local_14 < *(int *)(in_RDI + (long)local_10 * 0x18 + 0x14) + local_18) {
      local_14 = *(int *)(in_RDI + (long)local_10 * 0x18 + 0x14) + local_18;
    }
    local_10 = local_10 + 1;
    in_stack_ffffffffffffffdc = local_14;
  }
  return local_14;
}

Assistant:

extern
int
FMstruct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if ((is_var_array_field(list, i) == 1) || (strchr(list[i].field_type, '*'))) {
	    /* variant array, real_field_size is fmformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}